

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O1

attr_list decode_attr_from_xmit(void *buf)

{
  size_t __n;
  int4 *piVar1;
  char cVar2;
  int4 iVar3;
  undefined4 uVar4;
  int iVar5;
  int_attr_struct *__dest;
  attr_p paVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  ushort uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ushort uVar14;
  attr_list p_Var15;
  ulong uVar16;
  void *__dest_00;
  attr_union *paVar17;
  double *pdVar18;
  attr_union *buf_00;
  double *pdVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar22 [16];
  
  __n = (ulong)*(byte *)((long)buf + 1) * 8 + 4;
  p_Var15 = internal_create_attr_list((uint)*(byte *)((long)buf + 1),(uint)*(byte *)((long)buf + 2))
  ;
  cVar2 = *buf;
  if (words_bigendian == '\0') {
    words_bigendian = '\x01';
  }
  __dest = (p_Var15->l).list.iattrs;
  memcpy(__dest,buf,__n);
  if (words_bigendian == '\0') {
    words_bigendian = '\x01';
  }
  __dest->byte_order = '\0';
  if ((cVar2 != '\0') && (*(char *)((long)buf + 1) != '\0')) {
    uVar16 = 0;
    do {
      iVar3 = __dest->iattr[uVar16].attr_id;
      auVar23._8_8_ = 0;
      auVar23._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)iVar3 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)iVar3 >> 0x10),iVar3)) >>
                                                  0x20),iVar3) >> 0x18),
                                           CONCAT12((char)((uint)iVar3 >> 8),(short)iVar3)) >> 0x10)
                           ,(short)iVar3) & 0xffff00ff00ff00ff;
      auVar23 = pshuflw(auVar23,auVar23,0x1b);
      sVar7 = auVar23._0_2_;
      sVar8 = auVar23._2_2_;
      sVar9 = auVar23._4_2_;
      sVar10 = auVar23._6_2_;
      __dest->iattr[uVar16].attr_id =
           CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar23[6] - (0xff < sVar10),
                    CONCAT12((0 < sVar9) * (sVar9 < 0x100) * auVar23[4] - (0xff < sVar9),
                             CONCAT11((0 < sVar8) * (sVar8 < 0x100) * auVar23[2] - (0xff < sVar8),
                                      (0 < sVar7) * (sVar7 < 0x100) * auVar23[0] - (0xff < sVar7))))
      ;
      iVar3 = __dest->iattr[uVar16].value;
      auVar24._8_8_ = 0;
      auVar24._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)iVar3 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)iVar3 >> 0x10),iVar3)) >>
                                                  0x20),iVar3) >> 0x18),
                                           CONCAT12((char)((uint)iVar3 >> 8),(short)iVar3)) >> 0x10)
                           ,(short)iVar3) & 0xffff00ff00ff00ff;
      auVar23 = pshuflw(auVar24,auVar24,0x1b);
      sVar7 = auVar23._0_2_;
      sVar8 = auVar23._2_2_;
      sVar9 = auVar23._4_2_;
      sVar10 = auVar23._6_2_;
      piVar1 = &__dest->iattr[uVar16].value;
      *(char *)piVar1 = (0 < sVar7) * (sVar7 < 0x100) * auVar23[0] - (0xff < sVar7);
      *(char *)((long)piVar1 + 1) = (0 < sVar8) * (sVar8 < 0x100) * auVar23[2] - (0xff < sVar8);
      *(char *)((long)piVar1 + 2) = (0 < sVar9) * (sVar9 < 0x100) * auVar23[4] - (0xff < sVar9);
      *(char *)((long)piVar1 + 3) = (0 < sVar10) * (sVar10 < 0x100) * auVar23[6] - (0xff < sVar10);
      uVar16 = uVar16 + 1;
    } while (uVar16 < *(byte *)((long)buf + 1));
  }
  if (*(char *)((long)buf + 2) != '\0') {
    paVar6 = (p_Var15->l).list.attributes;
    buf_00 = &paVar6->value;
    uVar16 = 0;
    pdVar19 = (double *)(__n + (long)buf);
    do {
      *(double *)((long)(buf_00 + -1) + 8) = *pdVar19;
      if (cVar2 != '\0') {
        uVar4 = *(undefined4 *)((long)(buf_00 + -1) + 8);
        auVar23 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)uVar4 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar4 >> 0x10),uVar4)) >>
                                                  0x20),uVar4) >> 0x18),(char)((uint)uVar4 >> 8)),
                                   (ushort)(byte)uVar4) & 0xffffff00ffffff);
        auVar23 = pshuflw(auVar23,auVar23,0x1b);
        sVar7 = auVar23._0_2_;
        sVar8 = auVar23._2_2_;
        sVar9 = auVar23._4_2_;
        sVar10 = auVar23._6_2_;
        *(uint *)((long)(buf_00 + -1) + 8) =
             CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar23[6] - (0xff < sVar10),
                      CONCAT12((0 < sVar9) * (sVar9 < 0x100) * auVar23[4] - (0xff < sVar9),
                               CONCAT11((0 < sVar8) * (sVar8 < 0x100) * auVar23[2] - (0xff < sVar8),
                                        (0 < sVar7) * (sVar7 < 0x100) * auVar23[0] - (0xff < sVar7))
                              ));
        uVar4 = *(undefined4 *)((long)(buf_00 + -1) + 0xc);
        auVar20._8_8_ = 0;
        auVar20._0_8_ =
             (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)uVar4 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar4 >> 0x10),uVar4)) >>
                                                  0x20),uVar4) >> 0x18),
                                             CONCAT12((char)((uint)uVar4 >> 8),(short)uVar4)) >>
                                   0x10),(short)uVar4) & 0xffff00ff00ff00ff;
        auVar23 = pshuflw(auVar20,auVar20,0x1b);
        sVar7 = auVar23._0_2_;
        sVar8 = auVar23._2_2_;
        sVar9 = auVar23._4_2_;
        sVar10 = auVar23._6_2_;
        *(uint *)((long)(buf_00 + -1) + 0xc) =
             CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar23[6] - (0xff < sVar10),
                      CONCAT12((0 < sVar9) * (sVar9 < 0x100) * auVar23[4] - (0xff < sVar9),
                               CONCAT11((0 < sVar8) * (sVar8 < 0x100) * auVar23[2] - (0xff < sVar8),
                                        (0 < sVar7) * (sVar7 < 0x100) * auVar23[0] - (0xff < sVar7))
                              ));
      }
      pdVar18 = pdVar19 + 1;
      switch(*(undefined4 *)((long)(buf_00 + -1) + 0xc)) {
      case 0:
      case 1:
      case 7:
      case 9:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                      ,0x72f,"attr_list decode_attr_from_xmit(void *)");
      case 2:
      case 8:
        (buf_00->u).d = *pdVar18;
        if (cVar2 != '\0') {
          byte_swap((char *)buf_00,8);
        }
        pdVar18 = pdVar19 + 2;
        break;
      case 3:
      case 4:
        uVar14 = *(ushort *)(pdVar19 + 1);
        uVar11 = uVar14 >> 8;
        if (cVar2 == '\0') {
          uVar11 = uVar14;
          uVar14 = uVar14 >> 8;
        }
        uVar14 = uVar11 & 0xff | uVar14 << 8;
        iVar5 = *(int *)((long)(buf_00 + -1) + 0xc);
        __dest_00 = malloc((long)(short)uVar14);
        memcpy(__dest_00,(void *)((long)pdVar19 + 10),(long)(short)uVar14);
        paVar17 = buf_00;
        if (iVar5 != 3) {
          (buf_00->u).i = (int)(short)uVar14;
          paVar17 = (attr_union *)((long)&paVar6[uVar16].value.u + 8);
        }
        (paVar17->u).p = __dest_00;
        pdVar18 = (double *)
                  ((long)pdVar19 + 10 + (long)(int)((int)(short)uVar14 + 5U & 0xfffffffc) + -2);
        break;
      case 5:
        (buf_00->u).f = *(float *)pdVar18;
        if (cVar2 != '\0') {
          iVar5 = (buf_00->u).i;
          auVar13._1_9_ = SUB169(ZEXT816(0) << 0x40,7);
          auVar13[0] = (char)((uint)iVar5 >> 0x18);
          auVar13._10_6_ = 0;
          auVar22._5_11_ = SUB1611(auVar13 << 0x30,5);
          auVar22[4] = (char)((uint)iVar5 >> 0x10);
          auVar22._0_4_ = iVar5;
          auVar12._12_4_ = 0;
          auVar12._0_12_ = auVar22._4_12_;
          auVar21._3_13_ = SUB1613(auVar12 << 0x20,3);
          auVar21[2] = (char)((uint)iVar5 >> 8);
          auVar21[0] = (byte)iVar5;
          auVar21[1] = 0;
          auVar23 = pshuflw(auVar21,auVar21,0x1b);
          sVar7 = auVar23._0_2_;
          sVar8 = auVar23._2_2_;
          sVar9 = auVar23._4_2_;
          sVar10 = auVar23._6_2_;
          (buf_00->u).i =
               CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar23[6] - (0xff < sVar10),
                        CONCAT12((0 < sVar9) * (sVar9 < 0x100) * auVar23[4] - (0xff < sVar9),
                                 CONCAT11((0 < sVar8) * (sVar8 < 0x100) * auVar23[2] -
                                          (0xff < sVar8),
                                          (0 < sVar7) * (sVar7 < 0x100) * auVar23[0] -
                                          (0xff < sVar7))));
        }
        pdVar18 = (double *)((long)pdVar19 + 0xc);
        break;
      case 6:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                      ,0x756,"attr_list decode_attr_from_xmit(void *)");
      }
      uVar16 = uVar16 + 1;
      buf_00 = (attr_union *)((long)(buf_00 + 1) + 8);
      pdVar19 = pdVar18;
    } while (uVar16 < *(byte *)((long)buf + 2));
  }
  return p_Var15;
}

Assistant:

extern attr_list
decode_attr_from_xmit(void * buf)
{
    int_attr_p header = (int_attr_p) buf;
    int iattr_size = sizeof(struct int_attr_struct) + 
	(header->int_attr_count -1) * sizeof(int_attr);
    attr_list l = internal_create_attr_list(header->int_attr_count,
					    header->other_attr_count);
    /* byte swap if the encoders byte order is not equal to ours */
    int bswap = header->byte_order != WORDS_BIGENDIAN;
    char *optr = (char*)buf + iattr_size;
    int i;
    
    memcpy(l->l.list.iattrs, buf, iattr_size);
    l->l.list.iattrs->byte_order = WORDS_BIGENDIAN; /* overwrite original */
    if (bswap) {
	for (i=0; i < header->int_attr_count; i++) {
	    byte_swap((char*)&l->l.list.iattrs->iattr[i].attr_id, 4);
	    byte_swap((char*)&l->l.list.iattrs->iattr[i].value, 4);
	}
    }
    for (i=0; i< header->other_attr_count; i++) {
	memcpy(&l->l.list.attributes[i], optr, 8);
	if (bswap) {
	    byte_swap((char*)&l->l.list.attributes[i].attr_id, 4);
	    byte_swap((char*)&l->l.list.attributes[i].val_type, 4);
	}
	optr += 8;
	switch(l->l.list.attributes[i].val_type) {
	case Attr_Int4:
	case Attr_Undefined:
	case Attr_Float16:
	case Attr_Float4:
	    assert(0);
	    break;
	case Attr_Int8:
	    memcpy(&l->l.list.attributes[i].value, optr, 8);
	    if (bswap) byte_swap((char*)&l->l.list.attributes[i].value, 8);
	    optr += 8;
	    break;
	case Attr_Float8:
	    memcpy(&l->l.list.attributes[i].value, optr, 8);
	    if (bswap) byte_swap((char*)&l->l.list.attributes[i].value, 8);
	    optr += 8;
	    break;
	case Attr_Atom:
	    memcpy(&l->l.list.attributes[i].value, optr, 4);
	    if (bswap) byte_swap((char*)&l->l.list.attributes[i].value, 4);
	    optr += 4;
	    break;
	case Attr_Opaque:
	case Attr_String: {
	    int2 len = *(int2*)optr;
	    int pad_len;
	    if (bswap) byte_swap((char*)&len, 2);
	    pad_len = roundup4(len + 2) - 2;
	    optr += 2;
	    if (l->l.list.attributes[i].val_type == Attr_String) {
		char *value = malloc(len);
		memcpy(value, optr, len);
		l->l.list.attributes[i].value.u.p = value;
	    } else {
		attr_opaque op;
		op.length = len;
		op.buffer = malloc(len);
		memcpy(op.buffer, optr, len);
		l->l.list.attributes[i].value.u.o = op;
	    }
	    optr += pad_len;
	    break;
	  }
	case Attr_List:
	    assert(0);
	    break;
	}
    }
    return l;
}